

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# registry.h
# Opt level: O2

void __thiscall
ut::registry::add_test<agge::tests::QuadraticBezierCurveTests>
          (registry *this,offset_in_QuadraticBezierCurveTests_to_subr method,char *name)

{
  test_case_impl<agge::tests::QuadraticBezierCurveTests> *this_00;
  char *in_RCX;
  pair<std::_Rb_tree_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar1;
  allocator local_c1;
  shared_ptr<ut::test_case_impl<agge::tests::QuadraticBezierCurveTests>,_unsigned_int> tc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  char *local_90;
  code *local_88;
  char *local_80;
  code *local_78;
  shared_ptr<ut::setup_impl<agge::tests::QuadraticBezierCurveTests>,_unsigned_int> local_70;
  shared_ptr<ut::setup_impl<agge::tests::QuadraticBezierCurveTests>,_unsigned_int> setup;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  get_setup<agge::tests::QuadraticBezierCurveTests>((registry *)&setup);
  this_00 = (test_case_impl<agge::tests::QuadraticBezierCurveTests> *)operator_new(0x38);
  std::__cxx11::string::string((string *)&local_b0,in_RCX,(allocator *)&local_50);
  local_70._ptr = setup._ptr;
  local_70._refcount = setup._refcount;
  if (setup._refcount != (uint *)0x0) {
    *setup._refcount = *setup._refcount + 1;
  }
  test_case_impl<agge::tests::QuadraticBezierCurveTests>::test_case_impl
            (this_00,method,(string *)name,
             (shared_ptr<ut::setup_impl<agge::tests::QuadraticBezierCurveTests>,_unsigned_int> *)
             &local_b0);
  tc._ptr = this_00;
  tc._refcount = (uint *)operator_new(4);
  *tc._refcount = 1;
  shared_ptr<ut::setup_impl<agge::tests::QuadraticBezierCurveTests>,_unsigned_int>::reset(&local_70)
  ;
  std::__cxx11::string::_M_dispose();
  (*(this_00->super_test_case).super_destructible._vptr_destructible[2])(&local_80,this_00);
  std::__cxx11::string::string((string *)&local_50,local_80,&local_c1);
  (*((tc._ptr)->super_test_case).super_destructible._vptr_destructible[3])(&local_90);
  std::operator+(&local_b0,&local_50,local_90);
  pVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::_M_insert_unique(&(this->_registered_names)._M_t,&local_b0);
  std::__cxx11::string::_M_dispose();
  (*local_88)(local_90);
  std::__cxx11::string::_M_dispose();
  (*local_78)(local_80);
  if (((undefined1  [16])pVar1 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
    local_b0._M_dataplus._M_p = (pointer)tc._ptr;
    local_b0._M_string_length = (size_type)tc._refcount;
    if (tc._refcount != (uint *)0x0) {
      *tc._refcount = *tc._refcount + 1;
    }
    std::
    vector<ut::shared_ptr<ut::test_case,_unsigned_int>,_std::allocator<ut::shared_ptr<ut::test_case,_unsigned_int>_>_>
    ::push_back(&this->_test_cases,(value_type *)&local_b0);
    shared_ptr<ut::test_case,_unsigned_int>::reset
              ((shared_ptr<ut::test_case,_unsigned_int> *)&local_b0);
  }
  shared_ptr<ut::test_case_impl<agge::tests::QuadraticBezierCurveTests>,_unsigned_int>::reset(&tc);
  shared_ptr<ut::setup_impl<agge::tests::QuadraticBezierCurveTests>,_unsigned_int>::reset(&setup);
  return;
}

Assistant:

inline void registry::add_test(void (FixtureT::*method)(), const char *name)
	{
		typedef test_case_impl<FixtureT> test_case;
		typedef setup_impl<FixtureT> fixture_setup;

		shared_ptr<fixture_setup> setup(get_setup<FixtureT>());
		shared_ptr<test_case> tc(new test_case_impl<FixtureT>(method, name, setup));

		if (_registered_names.insert(std::string(tc->fixture_name().c_str()) + tc->name().c_str()).second)
			_test_cases.push_back(tc);
	}